

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O0

void amrex::average_down_nodal<amrex::IArrayBox>
               (FabArray<amrex::IArrayBox> *fine,FabArray<amrex::IArrayBox> *crse,IntVect *ratio,
               int ngcrse,bool mfiter_is_definitely_safe)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BATType BVar7;
  bool bVar8;
  int iVar9;
  BoxArray *bxs;
  FabArray<amrex::IArrayBox> *this;
  undefined4 in_ECX;
  FabArray<amrex::IArrayBox> *in_RDX;
  FabArray<amrex::IArrayBox> *in_RSI;
  FabArrayBase *in_RDI;
  undefined1 in_R8B;
  FabArray<amrex::IArrayBox> ctmp;
  Box tbx;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  Array4<const_int> *finearr;
  Array4<int> *crsearr;
  Box *bx;
  MFIter mfi;
  int ncomp;
  int i;
  int jj;
  int j;
  int kk;
  int k;
  int n;
  int facz;
  int facy;
  int facx;
  Dim3 chi;
  Dim3 clo;
  BoxArray *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  FabArrayBase *in_stack_fffffffffffffa20;
  BoxArray *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffa38;
  undefined1 *puVar10;
  MFIter *in_stack_fffffffffffffa40;
  DistributionMapping *dm;
  FabFactory<amrex::IArrayBox> *in_stack_fffffffffffffa60;
  Box *__return_storage_ptr__;
  undefined8 in_stack_fffffffffffffa68;
  FabArray<amrex::IArrayBox> *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  MFIter *in_stack_fffffffffffffa80;
  int iVar11;
  Periodicity *period;
  CpOp op;
  DistributionMapping local_548 [30];
  Box local_35c;
  iterator local_340;
  iterator local_328;
  undefined1 local_310 [40];
  undefined1 *local_2e8;
  long local_2e0 [8];
  long *local_2a0;
  long local_298 [8];
  long *local_258;
  undefined1 local_24c [28];
  undefined1 *local_230;
  MFIter local_228;
  undefined1 in_stack_fffffffffffffe3b;
  int iVar12;
  undefined3 in_stack_fffffffffffffe40;
  uint uVar13;
  undefined4 uVar14;
  int local_19c;
  int local_194;
  int local_18c;
  int local_188;
  
  uVar13 = CONCAT13(in_R8B,in_stack_fffffffffffffe40) & 0x1ffffff;
  iVar9 = FabArrayBase::nComp(&in_RSI->super_FabArrayBase);
  if (((uVar13 & 0x1000000) != 0) ||
     (bVar8 = isMFIterSafe(in_stack_fffffffffffffa20,
                           (FabArrayBase *)
                           CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)), bVar8)) {
    do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffa34 >> 0x18);
    TilingIfNotGPU();
    MFIter::MFIter(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,(bool)do_tiling_);
    while (bVar8 = MFIter::isValid(&local_228), bVar8) {
      MFIter::growntilebox(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      local_230 = local_24c;
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 (MFIter *)in_stack_fffffffffffffa10);
      local_258 = local_298;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 (MFIter *)in_stack_fffffffffffffa10);
      local_2a0 = local_2e0;
      Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffffa10);
      local_2e8 = local_310;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_fffffffffffffa10);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_fffffffffffffa10);
      while (bVar8 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                               (&local_328,&local_340), bVar8) {
        __return_storage_ptr__ = &local_35c;
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                  (__return_storage_ptr__,&local_328);
        iVar12 = (__return_storage_ptr__->smallend).vect[0];
        iVar11 = (__return_storage_ptr__->smallend).vect[1];
        iVar1 = (__return_storage_ptr__->smallend).vect[2];
        iVar2 = (__return_storage_ptr__->bigend).vect[0];
        iVar3 = (__return_storage_ptr__->bigend).vect[1];
        iVar4 = (__return_storage_ptr__->bigend).vect[2];
        iVar5 = *(int *)&(in_RDX->super_FabArrayBase)._vptr_FabArrayBase;
        iVar6 = *(int *)((long)&(in_RDX->super_FabArrayBase)._vptr_FabArrayBase + 4);
        BVar7 = (in_RDX->super_FabArrayBase).boxarray.m_bat.m_bat_type;
        for (local_188 = 0; local_18c = iVar1, local_188 < iVar9; local_188 = local_188 + 1) {
          for (; local_18c <= iVar4; local_18c = local_18c + 1) {
            for (local_194 = iVar11; local_194 <= iVar3; local_194 = local_194 + 1) {
              for (local_19c = iVar12; local_19c <= iVar2; local_19c = local_19c + 1) {
                *(undefined4 *)
                 (*local_258 +
                 ((long)(local_19c - (int)local_258[4]) +
                  (long)(local_194 - *(int *)((long)local_258 + 0x24)) * local_258[1] +
                  (long)(local_18c - (int)local_258[5]) * local_258[2] +
                 (long)local_188 * local_258[3]) * 4) =
                     *(undefined4 *)
                      (*local_2a0 +
                      ((long)(local_19c * iVar5 - (int)local_2a0[4]) +
                       (long)(local_194 * iVar6 - *(int *)((long)local_2a0 + 0x24)) * local_2a0[1] +
                       (long)(int)(local_18c * BVar7 - (int)local_2a0[5]) * local_2a0[2] +
                      (long)local_188 * local_2a0[3]) * 4);
              }
            }
          }
        }
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_328);
      }
      MFIter::operator++(&local_228);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa10);
  }
  else {
    FabArrayBase::boxArray(in_RDI);
    dm = local_548;
    coarsen(in_stack_fffffffffffffa28,(IntVect *)in_stack_fffffffffffffa20);
    bxs = (BoxArray *)FabArrayBase::DistributionMap(in_RDI);
    period = (Periodicity *)0x0;
    op = COPY;
    iVar11 = 0;
    iVar12 = iVar9;
    uVar14 = in_ECX;
    MFInfo::MFInfo((MFInfo *)0x16902af);
    puVar10 = &stack0xfffffffffffffa80;
    DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::IArrayBox> *)in_stack_fffffffffffffa10);
    FabArray<amrex::IArrayBox>::FabArray
              ((FabArray<amrex::IArrayBox> *)CONCAT44(in_ECX,iVar9),bxs,dm,
               (int)((ulong)puVar10 >> 0x20),(int)puVar10,
               (MFInfo *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa60);
    DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::IArrayBox> *)0x1690303);
    MFInfo::~MFInfo((MFInfo *)0x1690310);
    BoxArray::~BoxArray(in_stack_fffffffffffffa10);
    average_down_nodal<amrex::IArrayBox>
              (in_RSI,in_RDX,(IntVect *)CONCAT44(uVar14,uVar13),iVar12,
               (bool)in_stack_fffffffffffffe3b);
    this = (FabArray<amrex::IArrayBox> *)Periodicity::NonPeriodic();
    FabArray<amrex::IArrayBox>::ParallelCopy
              ((FabArray<amrex::IArrayBox> *)
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (int)in_stack_fffffffffffffa68,(int)((ulong)in_stack_fffffffffffffa60 >> 0x20),
               (int)in_stack_fffffffffffffa60,iVar11,period,op);
    FabArray<amrex::IArrayBox>::~FabArray(this);
  }
  return;
}

Assistant:

void average_down_nodal (const FabArray<FAB>& fine, FabArray<FAB>& crse,
                         const IntVect& ratio, int ngcrse, bool mfiter_is_definitely_safe)
{
    AMREX_ASSERT(fine.is_nodal());
    AMREX_ASSERT(crse.is_nodal());
    AMREX_ASSERT(crse.nComp() == fine.nComp());

    int ncomp = crse.nComp();
    using value_type = typename FAB::value_type;

    if (mfiter_is_definitely_safe || isMFIterSafe(fine, crse))
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(ngcrse);
            Array4<value_type> const& crsearr = crse.array(mfi);
            Array4<value_type const> const& finearr = fine.const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                amrex_avgdown_nodes(tbx,crsearr,finearr,0,0,ncomp,ratio);
            });
        }
    }
    else
    {
        FabArray<FAB> ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                           ncomp, ngcrse);
        average_down_nodal(fine, ctmp, ratio, ngcrse);
        crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
    }
}